

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-homedir.c
# Opt level: O1

int run_test_homedir(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  size_t sVar2;
  long lVar3;
  long lVar4;
  uv_timer_t *puVar5;
  undefined8 uVar6;
  uint uVar7;
  uv_idle_t *puVar8;
  uv_check_t *puVar9;
  size_t len;
  char homedir [1024];
  undefined8 local_410;
  char local_408 [1024];
  
  local_410 = 0x400;
  local_408[0] = '\0';
  iVar1 = uv_os_homedir();
  if (iVar1 == 0) {
    sVar2 = strlen(local_408);
    if (sVar2 != local_410) goto LAB_0015ce69;
    if (local_410 == 0) goto LAB_0015ce6e;
    if (local_408[local_410] != '\0') goto LAB_0015ce73;
    sVar2 = local_410;
    if (local_410 == 1) {
      if (local_408[0] != '/') {
        run_test_homedir_cold_5();
        goto LAB_0015cdee;
      }
LAB_0015cdf9:
      local_410 = 1;
      iVar1 = uv_os_homedir(local_408);
      if (iVar1 != -0x69) goto LAB_0015ce78;
      if (local_410 < 2) goto LAB_0015ce7d;
      iVar1 = uv_os_homedir(0,&local_410);
      if (iVar1 != -0x16) goto LAB_0015ce82;
      iVar1 = uv_os_homedir(local_408,0);
      if (iVar1 != -0x16) goto LAB_0015ce87;
      local_410 = 0;
      iVar1 = uv_os_homedir(local_408);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_0015ce8c;
    }
LAB_0015cdee:
    if (local_408[sVar2 - 1] != '/') goto LAB_0015cdf9;
  }
  else {
    run_test_homedir_cold_1();
LAB_0015ce69:
    run_test_homedir_cold_2();
LAB_0015ce6e:
    run_test_homedir_cold_11();
LAB_0015ce73:
    run_test_homedir_cold_3();
LAB_0015ce78:
    run_test_homedir_cold_6();
LAB_0015ce7d:
    run_test_homedir_cold_7();
LAB_0015ce82:
    run_test_homedir_cold_8();
LAB_0015ce87:
    run_test_homedir_cold_9();
LAB_0015ce8c:
    run_test_homedir_cold_10();
  }
  run_test_homedir_cold_4();
  uVar7 = 0x4c;
  while( true ) {
    lVar3 = uv_hrtime();
    uv_sleep(0x2d);
    lVar4 = uv_hrtime();
    if ((ulong)(lVar4 - lVar3) < 0x17d7841) break;
    uVar7 = uVar7 - 1;
    if (uVar7 < 2) {
      return 0;
    }
  }
  run_test_hrtime_cold_1();
  puVar5 = (uv_timer_t *)uv_default_loop();
  iVar1 = uv_idle_init(puVar5,&idle_handle);
  if (iVar1 == 0) {
    puVar8 = &idle_handle;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    puVar5 = (uv_timer_t *)puVar8;
    if (iVar1 != 0) goto LAB_0015cfec;
    puVar5 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_check_init(puVar5,&check_handle);
    if (iVar1 != 0) goto LAB_0015cff1;
    puVar9 = &check_handle;
    iVar1 = uv_check_start(&check_handle,check_cb);
    puVar5 = (uv_timer_t *)puVar9;
    if (iVar1 != 0) goto LAB_0015cff6;
    puVar5 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar5,&timer_handle);
    if (iVar1 != 0) goto LAB_0015cffb;
    puVar5 = &timer_handle;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 != 0) goto LAB_0015d000;
    puVar5 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_run(puVar5,0);
    if (iVar1 != 0) goto LAB_0015d005;
    if (idle_cb_called < 1) goto LAB_0015d00a;
    if (timer_cb_called != 1) goto LAB_0015d00f;
    if (close_cb_called == 3) {
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uv_run(uVar6,0);
      puVar5 = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015d019;
    }
  }
  else {
    run_test_idle_starvation_cold_1();
LAB_0015cfec:
    run_test_idle_starvation_cold_2();
LAB_0015cff1:
    run_test_idle_starvation_cold_3();
LAB_0015cff6:
    run_test_idle_starvation_cold_4();
LAB_0015cffb:
    run_test_idle_starvation_cold_5();
LAB_0015d000:
    run_test_idle_starvation_cold_6();
LAB_0015d005:
    run_test_idle_starvation_cold_7();
LAB_0015d00a:
    run_test_idle_starvation_cold_8();
LAB_0015d00f:
    run_test_idle_starvation_cold_9();
  }
  run_test_idle_starvation_cold_10();
LAB_0015d019:
  run_test_idle_starvation_cold_11();
  if (puVar5 == (uv_timer_t *)&idle_handle) {
    idle_cb_cold_2();
    return extraout_EAX;
  }
  idle_cb_cold_1();
  if (puVar5 == (uv_timer_t *)&check_handle) {
    check_cb_cold_2();
    return extraout_EAX_00;
  }
  check_cb_cold_1();
  if (puVar5 == &timer_handle) {
    timer_cb_cold_2();
    return extraout_EAX_01;
  }
  timer_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(homedir) {
  char homedir[PATHMAX];
  size_t len;
  int r;

  /* Test the normal case */
  len = sizeof homedir;
  homedir[0] = '\0';
  ASSERT(strlen(homedir) == 0);
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == 0);
  ASSERT(strlen(homedir) == len);
  ASSERT(len > 0);
  ASSERT(homedir[len] == '\0');

#ifdef _WIN32
  if (len == 3 && homedir[1] == ':')
    ASSERT(homedir[2] == '\\');
  else
    ASSERT(homedir[len - 1] != '\\');
#else
  if (len == 1)
    ASSERT(homedir[0] == '/');
  else
    ASSERT(homedir[len - 1] != '/');
#endif

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(len > SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_homedir(NULL, &len);
  ASSERT(r == UV_EINVAL);
  r = uv_os_homedir(homedir, NULL);
  ASSERT(r == UV_EINVAL);
  len = 0;
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == UV_EINVAL);

  return 0;
}